

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaselineComparison.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  Count true_triangle_count;
  pointer pdVar2;
  pointer piVar3;
  pointer pbVar4;
  bool bVar5;
  ErrorCode EVar6;
  uint uVar7;
  ostream *poVar8;
  pointer pdVar9;
  pointer piVar10;
  ulong uVar11;
  pointer pbVar12;
  Parameters *params_00;
  VertexIdx sC;
  long lVar13;
  CGraph cg;
  Parameters params;
  uniform_int_distribution<long> dist_seed_vertex;
  config_params cfp;
  VertexIdx seed;
  Parameters local_2b30;
  Parameters local_2a88;
  Parameters local_29e0;
  Parameters local_2938;
  Parameters local_2890;
  Parameters local_27e8;
  random_device rd;
  mt19937 mt;
  
  if (argc == 2) {
    LoadConfig(&cfp,argv[1]);
    for (uVar11 = 0;
        uVar11 < (ulong)((long)cfp.input_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)cfp.input_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar11 = uVar11 + 1)
    {
      std::chrono::_V2::system_clock::now();
      EVar6 = Escape::loadGraphCSR
                        (cfp.input_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,&cg,1);
      if (EVar6 != ecNone) {
        exit(1);
      }
      std::chrono::_V2::system_clock::now();
      poVar8 = std::operator<<((ostream *)&std::cout,"Time to load graph = ");
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      poVar8 = std::operator<<(poVar8," seconds");
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,"#Graph name : ");
      poVar8 = std::operator<<(poVar8,(string *)
                                      (cfp.input_files.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar11));
      poVar8 = std::operator<<(poVar8,"#Vertices = ");
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      poVar8 = std::operator<<(poVar8,",#Edges = ");
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      Parameters::Parameters(&params);
      std::__cxx11::string::_M_assign((string *)&params);
      params.no_of_repeat = cfp.no_of_repeats;
      params.print_to_console = cfp.print_to_console;
      params.print_to_file = cfp.print_to_file;
      std::__cxx11::string::_M_assign((string *)&params.out_directory);
      params.normalization_count_available = cfp.edge_count_available;
      std::random_device::random_device(&rd);
      uVar7 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&mt,(ulong)uVar7);
      pdVar2 = cfp.sparsification_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar9 = cfp.sparsification_prob.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          piVar3 = cfp.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish, pdVar9 != pdVar2; pdVar9 = pdVar9 + 1) {
        dVar1 = *pdVar9;
        for (piVar10 = cfp.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar10 != piVar3; piVar10 = piVar10 + 1) {
          params.seed_count = (VertexIdx)*piVar10;
          if (params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 params.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          dist_seed_vertex._M_param._M_a = 0;
          dist_seed_vertex._M_param._M_b = cg.nVertices + -1;
          for (lVar13 = 0;
              pbVar4 = cfp.algo_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              pbVar12 = cfp.algo_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, lVar13 < params.seed_count;
              lVar13 = lVar13 + 1) {
            seed = std::uniform_int_distribution<long>::operator()(&dist_seed_vertex,&mt);
            std::vector<long,std::allocator<long>>::emplace_back<long&>
                      ((vector<long,std::allocator<long>> *)&params.seed_vertices,(long *)&seed);
          }
          for (; pbVar12 != pbVar4; pbVar12 = pbVar12 + 1) {
            std::__cxx11::string::string((string *)&seed,(string *)pbVar12);
            std::__cxx11::string::_M_assign((string *)&params.algo_name);
            params.walk_length = (EdgeIdx)((double)cg.nEdges * dVar1);
            params.subsample_size = (EdgeIdx)((double)params.walk_length * cfp.subsample_prob);
            true_triangle_count =
                 cfp.triangle_count.super__Vector_base<long_long,_std::allocator<long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11];
            params.sparsification_prob = dVar1;
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&seed,"TETRIS");
            if (bVar5) {
              Parameters::Parameters(&local_27e8,&params);
              params_00 = &local_27e8;
              TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                        (&cg,params_00,true_triangle_count,TETRIS);
LAB_00109930:
              Parameters::~Parameters(params_00);
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&seed,"VertexMCMC");
              if (bVar5) {
                params.walk_length = (EdgeIdx)(double)((params.walk_length * 0x16) / 0x50);
                Parameters::Parameters(&local_2890,&params);
                params_00 = &local_2890;
                TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                          (&cg,params_00,true_triangle_count,VertexMCMC);
                goto LAB_00109930;
              }
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&seed,"SRW1");
              if (bVar5) {
                params.walk_length = (EdgeIdx)(double)((params.walk_length * 0x16) / 0x28);
                params.CSS = cfp.CSS;
                params.NB = cfp.NB;
                Parameters::Parameters(&local_2938,&params);
                params_00 = &local_2938;
                TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                          (&cg,params_00,true_triangle_count,SRW1);
                goto LAB_00109930;
              }
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&seed,"SERWC");
              if (bVar5) {
                params.walk_length = (EdgeIdx)(double)((params.walk_length * 2) / 3);
                Parameters::Parameters(&local_29e0,&params);
                params_00 = &local_29e0;
                TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                          (&cg,params_00,true_triangle_count,SERWC);
                goto LAB_00109930;
              }
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&seed,"SEC");
              if (bVar5) {
                params.walk_length = (EdgeIdx)(double)((params.walk_length * 2) / 3);
                Parameters::Parameters(&local_2a88,&params);
                params_00 = &local_2a88;
                TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                          (&cg,params_00,true_triangle_count,SEC);
                goto LAB_00109930;
              }
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&seed,"UESS");
              if (bVar5) {
                params.walk_length = (EdgeIdx)(double)params.walk_length;
                Parameters::Parameters(&local_2b30,&params);
                params_00 = &local_2b30;
                TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                          (&cg,params_00,true_triangle_count,UESS);
                goto LAB_00109930;
              }
              std::operator<<((ostream *)&std::cout,"Unknown algorithm option. \n");
            }
            std::__cxx11::string::~string((string *)&seed);
          }
        }
      }
      std::random_device::~random_device(&rd);
      Parameters::~Parameters(&params);
    }
    config_params::~config_params(&cfp);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Usage File: ./SubgraphCount script_file\n\n");
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    CGraph cg;
    if (argc != 2) {
        std::cout << "Usage File: ./SubgraphCount script_file\n\n";
        return 0;
    }
    config_params cfp = LoadConfig(argv[1]);

    for (int i = 0; i < cfp.input_files.size(); i++) {
        /**
         * Load the input graph and print relevant parameters
         */
        auto startTime = std::chrono::high_resolution_clock::now();
        if (loadGraphCSR(cfp.input_files[i].c_str(), cg, 1))
            exit(1);
        auto endTime = std::chrono::high_resolution_clock::now();
        std::cout << "Time to load graph = " <<
                  std::chrono::duration_cast<std::chrono::seconds>(endTime - startTime).count()
                  << " seconds" << std::endl;
        std::cout << "#Graph name : " << cfp.input_files[i] << "#Vertices = " << cg.nVertices << ",#Edges = " << cg.nEdges << std::endl;

        /**
         * Load relevant parameters
         */
        Parameters params;
        params.filename = cfp.input_files[i];
        params.no_of_repeat = cfp.no_of_repeats;
        params.print_to_console = cfp.print_to_console;
        params.print_to_file = cfp.print_to_file;
        params.out_directory = cfp.out_directory;
        params.normalization_count_available = cfp.edge_count_available;

        /**
         * Set up randomness initiator
         */
        std::random_device rd;
        std::mt19937 mt(rd());

        /**
         * For each sprisification parameter and seed count and algo_name,
         * run an instance
         */
        for (auto sparsification_prob : cfp.sparsification_prob) {
            for (auto seed_count: cfp.seed_count) {

                params.seed_count = seed_count;
                params.seed_vertices.clear();

                /**
                 * We fix the seed vertices and run for params.no_of_repeat many iterations with the
                 * seed vertex remaining fixed.
                 * We just need to
                 * sample uniform random seed vertex from the entire graph.
                 * THIS IS THE NORMAL MODE IN WHICH ALL BASELINE AND OUR
                 * ALGORITHMS ARE EXECUTED
                 */
                VertexIdx n = cg.nVertices;
                std::uniform_int_distribution<VertexIdx> dist_seed_vertex(0, n - 1);
                for (VertexIdx sC = 0; sC < params.seed_count; sC++) {
                    VertexIdx seed = dist_seed_vertex(mt); // TODO: verify randomness
                    params.seed_vertices.emplace_back(seed);
                }

                for (auto algo_name : cfp.algo_names) {
                    /**
                     * Update parameters for this particular run
                     */
                    params.algo_name = algo_name;
                    params.sparsification_prob = sparsification_prob;
                    params.walk_length = cg.nEdges * sparsification_prob; // g.nEdges is twice the number of edges
                    params.subsample_size = params.walk_length * cfp.subsample_prob;
                    EdgeIdx triangle_count = cfp.triangle_count[i];

                    if (algo_name == "TETRIS") {                     // Our Algorithm
                        TriangleEstimator(&cg, params, triangle_count, TETRIS);
                    } else if (algo_name == "VertexMCMC") {
                        // Vertex MCMC sees about 2.5 time more of the edges for same walk length. For comparsion, we adjust the walk length accordingly.
                        params.walk_length = floor(params.walk_length *22 / 80);
                        TriangleEstimator(&cg, params, triangle_count, VertexMCMC);
                    }
                    else if (algo_name == "SRW1") {
                        params.walk_length = floor(params.walk_length * 22 / 40);
                        params.CSS = cfp.CSS;
                        params.NB = cfp.NB;
                        TriangleEstimator(&cg, params, triangle_count, SRW1);
                    }
                    else if (algo_name == "SERWC") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length * 2 / 3);
                        TriangleEstimator(&cg, params, triangle_count, SERWC);
                    }
                    else if (algo_name == "SEC") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length *2/3);
                        TriangleEstimator(&cg, params, triangle_count, SEC);
                    }
                    else if (algo_name == "UESS") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length);
                        TriangleEstimator(&cg, params, triangle_count, UESS);
                    }
                    else
                        std::cout << "Unknown algorithm option. \n";
//                            // Baseline: sample an edge and count the number of triangles incident on it. Then scale.
//                        else if (algo_name == "EstTriByEdgeSampleAndCount")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByEdgeSampleAndCount);
//                            // Baseline: do a random walk and count the teiangles in induces multi-graph. Scale.
//                        else if (algo_name == "EstTriByRW")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByRW);
//                            // Sample an edge, sample a neighbor and estimate the teiangles incident on the neighbor. Scale up.
//                        else if (algo_name == "EstTriByRWandNborSampling")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByRWandNborSampling);
//                            // Sample each edge with probability p and count traingles in the subsampled graph. Scale by 1/p^3.
//                        else if (algo_name == "EstTriBySparsification")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriBySparsification);
//                            // Uniformly Sample edges, and count the number of triangles in the multi-graph.
//                        else if (algo_name == "UESS")
//                            TriangleEstimator(&cg, params, triangle_count, UESS);
                }
            }

        }
    }
    return 0;
}